

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O1

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  vector<unsigned_int> *pvVar1;
  byte *pbVar2;
  byte bVar3;
  uchar *puVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  void *pData_ptr;
  uint uVar11;
  uint uVar12;
  uint64 data;
  ulong uVar13;
  bool bVar14;
  
  uVar11 = this->m_max_probes * num_bytes;
  if (((this->m_matches).m_capacity < uVar11) &&
     (cVar5 = lzham::elemental_vector::increase_capacity
                        ((int)this + 0x78,SUB41(uVar11,0),
                         (uint)((this->m_matches).m_size + 1 == uVar11),
                         (_func_void_void_ptr_void_ptr_uint *)0x6,false), cVar5 == '\0')) {
    return false;
  }
  (this->m_matches).m_size = uVar11;
  if (((this->m_match_refs).m_capacity < num_bytes) &&
     (cVar5 = lzham::elemental_vector::increase_capacity
                        ((int)this + 0x90,SUB41(num_bytes,0),
                         (uint)((this->m_match_refs).m_size + 1 == num_bytes),
                         (_func_void_void_ptr_void_ptr_uint *)0x8,false), cVar5 == '\0')) {
    return false;
  }
  (this->m_match_refs).m_size = num_bytes;
  data = 0xff;
  memset((this->m_match_refs).m_p,0xff,(ulong)(num_bytes * 8));
  this->m_fill_lookahead_pos = this->m_lookahead_pos;
  this->m_fill_lookahead_size = num_bytes;
  this->m_fill_dict_size = this->m_cur_dict_size;
  this->m_next_match_ref = 0;
  if (((this->m_pTask_pool == (task_pool *)0x0) || (num_bytes < 0x400)) ||
     (this->m_max_helper_threads == 0)) {
    find_all_matches_callback_st(this,data,pData_ptr);
    this->m_num_completed_helper_threads = 0;
    goto LAB_0010f8d5;
  }
  uVar11 = num_bytes - 2;
  uVar8 = uVar11;
  do {
    uVar10 = this->m_fill_lookahead_pos + uVar8;
    uVar12 = this->m_max_dict_size_mask & uVar10;
    (this->m_nodes).m_p[uVar12].m_left = 0;
    (this->m_nodes).m_p[uVar12].m_right = 0;
    (this->m_match_refs).m_p[uVar10 - this->m_fill_lookahead_pos] = -2;
    uVar8 = uVar8 + 1;
  } while (uVar8 < num_bytes);
  uVar8 = this->m_max_helper_threads;
  if ((ulong)uVar8 != 0) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&this->m_thread_dict_offsets[0].m_size + lVar9) != 0) {
        *(undefined4 *)((long)&this->m_thread_dict_offsets[0].m_size + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x18;
    } while ((ulong)uVar8 * 0x18 != lVar9);
  }
  puVar4 = (this->m_dict).m_p;
  uVar7 = (ulong)(this->m_max_dict_size_mask & this->m_lookahead_pos);
  if (this->m_hash24 == false) {
    bVar14 = uVar11 != 0;
    if (bVar14) {
      pbVar2 = puVar4 + uVar7;
      lVar9 = 0;
      uVar8 = (uint)*pbVar2;
      uVar10 = (uint)pbVar2[1];
      do {
        bVar3 = pbVar2[lVar9 + 2];
        uVar8 = ((uint)bVar3 << 4 ^ (uVar10 << 8 | uVar8)) * -0x3f;
        uVar8 = uVar8 >> 0x11 ^ uVar8;
        uVar8 = uVar8 * -0x1ff ^ uVar8 * -0x1ff0;
        uVar8 = uVar8 * -7 ^ uVar8 * -0x1c00;
        pvVar1 = this->m_thread_dict_offsets +
                 (ulong)(uVar8 >> 0xf ^ uVar8) % (ulong)this->m_max_helper_threads;
        if (pvVar1->m_capacity <= pvVar1->m_size) {
          cVar5 = '\x01';
          cVar6 = lzham::elemental_vector::increase_capacity
                            ((uint)pvVar1,(bool)((char)pvVar1->m_size + '\x01'),1,
                             (_func_void_void_ptr_void_ptr_uint *)0x4,false);
          if (cVar6 == '\0') goto LAB_0010fa0e;
        }
        pvVar1->m_p[pvVar1->m_size] = (uint)lVar9;
        pvVar1->m_size = pvVar1->m_size + 1;
        lVar9 = lVar9 + 1;
        bVar14 = (uint)lVar9 < uVar11;
        uVar8 = uVar10;
        uVar10 = (uint)bVar3;
      } while (uVar11 != (uint)lVar9);
    }
    cVar5 = '\0';
LAB_0010fa0e:
    if (!bVar14) goto LAB_0010fa18;
  }
  else {
    uVar13 = (ulong)((uint)puVar4[uVar7 + 1] << 0x10 | (uint)puVar4[uVar7] << 8);
    if (uVar8 - 1 < (uVar8 ^ uVar8 - 1)) {
      bVar14 = uVar11 != 0;
      if (bVar14) {
        lVar9 = 0;
        do {
          uVar10 = (uint)puVar4[lVar9 + uVar7 + 2] << 0x10 | (uint)(uVar13 >> 8);
          uVar13 = (ulong)uVar10;
          uVar10 = uVar10 * -0x3f;
          uVar10 = uVar10 >> 0x11 ^ uVar10;
          uVar10 = uVar10 * -0x1ff ^ uVar10 * -0x1ff0;
          uVar10 = uVar10 * -7 ^ uVar10 * -0x1c00;
          pvVar1 = this->m_thread_dict_offsets + ((uVar10 >> 0xf ^ uVar10) & uVar8 - 1);
          if (pvVar1->m_capacity <= pvVar1->m_size) {
            cVar5 = '\x01';
            cVar6 = lzham::elemental_vector::increase_capacity
                              ((uint)pvVar1,(bool)((char)pvVar1->m_size + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x4,false);
            if (cVar6 == '\0') goto LAB_0010fb57;
          }
          pvVar1->m_p[pvVar1->m_size] = (uint)lVar9;
          pvVar1->m_size = pvVar1->m_size + 1;
          lVar9 = lVar9 + 1;
          bVar14 = (uint)lVar9 < uVar11;
        } while (uVar11 != (uint)lVar9);
      }
      cVar5 = '\0';
    }
    else {
      bVar14 = uVar11 != 0;
      if (bVar14) {
        lVar9 = 0;
        do {
          uVar8 = (uint)puVar4[lVar9 + uVar7 + 2] << 0x10 | (uint)(uVar13 >> 8);
          uVar13 = (ulong)uVar8;
          uVar8 = uVar8 * -0x3f;
          uVar8 = uVar8 >> 0x11 ^ uVar8;
          uVar8 = uVar8 * -0x1ff ^ uVar8 * -0x1ff0;
          uVar8 = uVar8 * -7 ^ uVar8 * -0x1c00;
          pvVar1 = this->m_thread_dict_offsets +
                   (ulong)(uVar8 >> 0xf ^ uVar8) % (ulong)this->m_max_helper_threads;
          if (pvVar1->m_capacity <= pvVar1->m_size) {
            cVar5 = '\x01';
            cVar6 = lzham::elemental_vector::increase_capacity
                              ((uint)pvVar1,(bool)((char)pvVar1->m_size + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x4,false);
            if (cVar6 == '\0') goto LAB_0010fb57;
          }
          pvVar1->m_p[pvVar1->m_size] = (uint)lVar9;
          pvVar1->m_size = pvVar1->m_size + 1;
          lVar9 = lVar9 + 1;
          bVar14 = (uint)lVar9 < uVar11;
        } while (uVar11 != (uint)lVar9);
      }
      cVar5 = '\v';
    }
LAB_0010fb57:
    if (!bVar14) {
      cVar5 = '\0';
    }
    if (cVar5 == '\0') {
LAB_0010fa18:
      this->m_num_completed_helper_threads = 0;
      bVar14 = task_pool::
               queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                         (this->m_pTask_pool,this,
                          (offset_in_search_accelerator_to_subr)find_all_matches_callback_mt,0,0,
                          (void *)(ulong)this->m_max_helper_threads);
      cVar5 = !bVar14;
    }
  }
  if (cVar5 != '\0') {
    return false;
  }
LAB_0010f8d5:
  if (this->m_len2_matches != true) {
    return true;
  }
  bVar14 = find_len2_matches(this);
  return bVar14;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
      {
         LZHAM_LOG_ERROR(9006);
         return false;
      }

      if (!m_match_refs.try_resize_no_construct(num_bytes))
      {
         LZHAM_LOG_ERROR(9007);
         return false;
      }

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if ((!m_pTask_pool) || (m_max_helper_threads < 1) || (num_bytes < 1024))
      {
         find_all_matches_callback_st(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         for (uint i = num_bytes - 2; i < num_bytes; i++)
         {
            uint fill_lookahead_pos = m_fill_lookahead_pos + i;
            uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
            m_nodes[insert_pos].m_left = 0;
            m_nodes[insert_pos].m_right = 0;

            m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)] = -2;
         }

         for (uint i = 0; i < m_max_helper_threads; i++)
            m_thread_dict_offsets[i].try_resize(0);

         uint bytes_to_add = num_bytes - 2;

         scoped_perf_section sect(cVarArgs, "****** find_all_matches_prep %u", bytes_to_add);
                       
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
                     
         if (m_hash24)
         {
            uint t = (pDict[0] << 8) | (pDict[1] << 16);

            if (math::is_power_of_2(m_max_helper_threads))
            {
               const uint bitmask = (m_max_helper_threads - 1);
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) & bitmask;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9008);
                     return false;
                  }

                  pDict++;
               }
            }
            else
            {
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) % m_max_helper_threads;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9009);
                     return false;
                  }

                  pDict++;
               }
            }
         }
         else
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];
                  
            for (uint i = 0; i < bytes_to_add; i++)
            {
               uint c2 = pDict[2];
               
               uint t = LZHAM_HASH3_16(c0, c1, c2);

               c0 = c1;
               c1 = c2;
                                                            
               uint thread_index = bitmix32(t) % m_max_helper_threads;

               if (!m_thread_dict_offsets[thread_index].try_push_back(i))
               {
                  LZHAM_LOG_ERROR(9010);
                  return false;
               }
               
               pDict++;
            }
         }
         
         m_num_completed_helper_threads = 0;
         
         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback_mt, 0, m_max_helper_threads))
         {
            LZHAM_LOG_ERROR(9011);
            return false;
         }
      }

      return m_len2_matches ? find_len2_matches() : true;
   }